

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlAttributePtr pxVar5;
  xmlChar fattr [50];
  xmlChar felem [50];
  xmlChar axStack_a8 [64];
  xmlChar local_68 [56];
  
  iVar1 = 0;
  iVar2 = 0;
  if ((attr != (xmlAttrPtr)0x0) && (pxVar3 = attr->name, iVar2 = iVar1, pxVar3 != (xmlChar *)0x0)) {
    if ((attr->ns == (xmlNs *)0x0) ||
       (((pxVar4 = attr->ns->prefix, pxVar4 == (xmlChar *)0x0 ||
         (iVar1 = strcmp((char *)pxVar3,"id"), iVar1 != 0)) ||
        (iVar1 = strcmp((char *)pxVar4,"xml"), iVar1 != 0)))) {
      if ((doc != (xmlDocPtr)0x0) &&
         (((doc->intSubset != (_xmlDtd *)0x0 || (doc->extSubset != (_xmlDtd *)0x0)) ||
          (doc->type == XML_HTML_DOCUMENT_NODE)))) {
        if (doc->type == XML_HTML_DOCUMENT_NODE) {
          iVar2 = xmlStrEqual("id",pxVar3);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = xmlStrEqual("name",attr->name);
          if (iVar2 != 0) {
            if (elem == (xmlNodePtr)0x0) {
              return 1;
            }
            iVar2 = xmlStrEqual(elem->name,"a");
            if (iVar2 != 0) {
              return 1;
            }
          }
        }
        else {
          if (elem == (xmlNodePtr)0x0) {
            return 0;
          }
          if ((elem->ns == (xmlNs *)0x0) || (pxVar3 = elem->ns->prefix, pxVar3 == (xmlChar *)0x0)) {
            pxVar3 = elem->name;
          }
          else {
            pxVar3 = xmlBuildQName(elem->name,pxVar3,local_68,0x32);
          }
          if ((attr->ns == (xmlNs *)0x0) || (pxVar4 = attr->ns->prefix, pxVar4 == (xmlChar *)0x0)) {
            pxVar4 = attr->name;
          }
          else {
            pxVar4 = xmlBuildQName(attr->name,pxVar4,axStack_a8,0x32);
          }
          pxVar5 = (xmlAttributePtr)0x0;
          if (((pxVar3 != (xmlChar *)0x0) && (pxVar4 != (xmlChar *)0x0)) &&
             (pxVar5 = xmlGetDtdAttrDesc(doc->intSubset,pxVar3,pxVar4),
             pxVar5 == (xmlAttributePtr)0x0)) {
            if (doc->extSubset == (xmlDtdPtr)0x0) {
              pxVar5 = (xmlAttributePtr)0x0;
            }
            else {
              pxVar5 = xmlGetDtdAttrDesc(doc->extSubset,pxVar3,pxVar4);
            }
          }
          if ((pxVar4 != axStack_a8) && (pxVar4 != attr->name)) {
            (*xmlFree)(pxVar4);
          }
          if ((pxVar3 != local_68) && (pxVar3 != elem->name)) {
            (*xmlFree)(pxVar3);
          }
          if ((pxVar5 != (xmlAttributePtr)0x0) && (pxVar5->atype == XML_ATTRIBUTE_ID)) {
            return 1;
          }
        }
        iVar2 = 0;
      }
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL)) return(0);
    if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
        (!strcmp((char *) attr->name, "id")) &&
        (!strcmp((char *) attr->ns->prefix, "xml")))
	return(1);
    if (doc == NULL) return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL) &&
        (doc->type != XML_HTML_DOCUMENT_NODE)) {
	return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if ((xmlStrEqual(BAD_CAST "id", attr->name)) ||
	    ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    ((elem == NULL) || (xmlStrEqual(elem->name, BAD_CAST "a")))))
	    return(1);
	return(0);
    } else if (elem == NULL) {
	return(0);
    } else {
	xmlAttributePtr attrDecl = NULL;

	xmlChar felem[50], fattr[50];
	xmlChar *fullelemname, *fullattrname;

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;

	fullattrname = (attr->ns != NULL && attr->ns->prefix != NULL) ?
	    xmlBuildQName(attr->name, attr->ns->prefix, fattr, 50) :
	    (xmlChar *)attr->name;

	if (fullelemname != NULL && fullattrname != NULL) {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, fullelemname,
		                         fullattrname);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, fullelemname,
					     fullattrname);
	}

	if ((fullattrname != fattr) && (fullattrname != attr->name))
	    xmlFree(fullattrname);
	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }
    return(0);
}